

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.h
# Opt level: O0

CScript * __thiscall CScript::push_int64(CScript *this,int64_t n)

{
  long lVar1;
  span<const_unsigned_char,_18446744073709551615UL> b;
  long in_RSI;
  CScript *in_RDI;
  long in_FS_OFFSET;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *in_stack_ffffffffffffff88;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff90;
  span<const_unsigned_char,_18446744073709551615UL> *this_00;
  CScript *in_stack_ffffffffffffffa8;
  pointer in_stack_ffffffffffffffc0;
  __extent_storage<18446744073709551615UL> in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RSI == -1) || ((0 < in_RSI && (in_RSI < 0x11)))) {
    prevector<28U,_unsigned_char,_unsigned_int,_int>::push_back
              (in_stack_ffffffffffffff88,(uchar *)0x1ab88e);
  }
  else if (in_RSI == 0) {
    prevector<28U,_unsigned_char,_unsigned_int,_int>::push_back
              (in_stack_ffffffffffffff88,(uchar *)0x1ab8af);
  }
  else {
    this_00 = (span<const_unsigned_char,_18446744073709551615UL> *)&stack0xffffffffffffffc0;
    CScriptNum::serialize((int64_t *)in_stack_ffffffffffffffc8._M_extent_value);
    std::span<const_unsigned_char,_18446744073709551615UL>::
    span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              (this_00,in_stack_ffffffffffffff90);
    b._M_extent._M_extent_value = in_stack_ffffffffffffffc8._M_extent_value;
    b._M_ptr = in_stack_ffffffffffffffc0;
    operator<<(in_stack_ffffffffffffffa8,b);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

CScript& push_int64(int64_t n)
    {
        if (n == -1 || (n >= 1 && n <= 16))
        {
            push_back(n + (OP_1 - 1));
        }
        else if (n == 0)
        {
            push_back(OP_0);
        }
        else
        {
            *this << CScriptNum::serialize(n);
        }
        return *this;
    }